

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O0

bool __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
k_relevant(LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,int x,int y,int k)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int lower_bound;
  int y_size;
  int x_size;
  int k_local;
  int y_local;
  int x_local;
  TreeIndexLGM *t2_local;
  TreeIndexLGM *t1_local;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToSize).postl_to_size_,(long)x);
  iVar6 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToSize).postl_to_size_,(long)y);
  iVar1 = *pvVar3;
  iVar2 = (t1->super_Constants).tree_size_;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToDepth).postl_to_depth_,(long)x);
  iVar4 = *pvVar3;
  iVar5 = (t2->super_Constants).tree_size_;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToDepth).postl_to_depth_,(long)y);
  iVar2 = ((iVar2 - (x + 1)) - iVar4) - ((iVar5 - (y + 1)) - *pvVar3);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToDepth).postl_to_depth_,(long)x);
  iVar4 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToDepth).postl_to_depth_,(long)y);
  iVar4 = iVar4 - *pvVar3;
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  iVar5 = iVar6 - iVar1;
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  iVar6 = ((x + 1) - iVar6) - ((y + 1) - iVar1);
  if (iVar6 < 1) {
    iVar6 = -iVar6;
  }
  return iVar2 + iVar4 + iVar5 + iVar6 <= k;
}

Assistant:

bool LGMTreeIndex<CostModel, TreeIndex>::k_relevant(const TreeIndex& t1,
    const TreeIndex& t2,const int x, const int y, const int k) const {
  // The lower bound formula (RA + D + L):
  // |(|T1|-(x+1))-(|T2|-(y+1))| + ||T1_x|-|T2_y|| + |((x+1)-|T1_x|)-((y+1)-|T2_y|)| < k
  // New lower bound formula (R + A + D + L):
  // |(|T1|-(x+1)-depth(x))-(|T2|-(y+1)-depth(y))| + |depth(x)-depth(y)| + ||T1_x|-|T2_y|| + |((x+1)-|T1_x|)-((y+1)-|T2_y|)| < k
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];
  // int lower_bound = std::abs((t1_size_.back() - (x+1)) - (t2_size_.back() - (y+1))) +
  //                   std::abs(x_size - y_size) +
  //                   std::abs(((x+1) - x_size) - ((y+1) - y_size));

  int lower_bound = std::abs((t1.tree_size_ - (x+1) - t1.postl_to_depth_[x]) - (t2.tree_size_ - (y+1) - t2.postl_to_depth_[y])) +
                    std::abs(t1.postl_to_depth_[x] - t2.postl_to_depth_[y]) +
                    std::abs(x_size - y_size) +
                    std::abs(((x+1) - x_size) - ((y+1) - y_size));

  // NOTE: The pair (x,y) is k-relevant if lower_bound <= k.
  //       lower_bound < k is not correct because then (x,y) would be
  //       k-irrelevant for lower_bound = k. That would further mean that the
  //       subtrees T1_x and T2_y cannot be mapped with the given budget.
  if (lower_bound <= k) {
    return true;
  }
  return false;
}